

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_policy_testing.h
# Opt level: O1

vector<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
* __thiscall
phmap::priv::
items<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>,4ul,std::mutex>>
          (vector<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
           *__return_storage_ptr__,priv *this,
          parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_std::mutex>
          *m)

{
  long lVar1;
  size_type __n;
  const_iterator __begin0;
  iterator local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar1 = 0x38;
  __n = 0;
  do {
    __n = __n + *(long *)(this + lVar1);
    lVar1 = lVar1 + 0x70;
  } while (lVar1 != 0x738);
  std::
  vector<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
  ::reserve(__return_storage_ptr__,__n);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::begin((const_iterator *)&local_40,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
           *)this);
  while (local_40.inner_ != (Inner *)0x0) {
    std::
    vector<std::pair<phmap::priv::NonStandardLayout,int>,std::allocator<std::pair<phmap::priv::NonStandardLayout,int>>>
    ::emplace_back<phmap::priv::NonStandardLayout_const&,int_const&>
              ((vector<std::pair<phmap::priv::NonStandardLayout,int>,std::allocator<std::pair<phmap::priv::NonStandardLayout,int>>>
                *)__return_storage_ptr__,(NonStandardLayout *)local_40.it_.field_1.slot_,
               (int *)((long)local_40.it_.field_1.slot_ + 0x28));
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
    ::iterator::operator++(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

auto items(const Map& m) -> std::vector<
    std::pair<typename Map::key_type, typename Map::mapped_type>> {
  using std::get;
  std::vector<std::pair<typename Map::key_type, typename Map::mapped_type>> res;
  res.reserve(m.size());
  for (const auto& v : m) res.emplace_back(get<0>(v), get<1>(v));
  return res;
}